

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int unixOpen(sqlite3_vfs *pVfs,char *zPath,sqlite3_file *pFile,int flags,int *pOutFlags)

{
  byte *pbVar1;
  bool bVar2;
  pid_t pVar3;
  undefined8 uVar4;
  _func_int_sqlite3_file_ptr *p_Var5;
  __pid_t _Var6;
  int iVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  sqlite3_io_methods *psVar11;
  size_t sVar12;
  int *piVar13;
  char *pcVar14;
  sqlite3_io_methods *psVar15;
  uint *puVar16;
  UnixUnusedFd *p;
  sqlite3_mutex *psVar17;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  char *pcVar21;
  mode_t m;
  sqlite3_io_methods *psVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint f;
  long in_FS_OFFSET;
  undefined1 auVar26 [16];
  char zTmpname [514];
  uint local_528;
  char local_4e8 [527];
  undefined1 uStack_2d9;
  undefined8 local_2d8;
  _func_int_sqlite3_file_ptr *p_Stack_2d0;
  uint local_2c0;
  uint local_2bc;
  uint local_2b8;
  undefined8 local_c8;
  undefined8 uStack_c0;
  uint local_b0;
  uint local_ac;
  uint local_a8;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar23 = flags & 0xfff00;
  if (((flags & 4U) == 0) ||
     (((bVar2 = true, uVar23 != 0x800 && (uVar23 != 0x4000)) && (uVar23 != 0x80000)))) {
    bVar2 = false;
  }
  memset(local_4e8,0xaa,0x202);
  pVar3 = randomnessPid;
  _Var6 = getpid();
  if (pVar3 != _Var6) {
    randomnessPid = getpid();
    sqlite3_randomness(0,(void *)0x0);
  }
  *(undefined1 (*) [16])(pFile + 0xc) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(pFile + 10) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(pFile + 8) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(pFile + 6) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(pFile + 4) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(pFile + 2) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])pFile = (undefined1  [16])0x0;
  pFile[0xe].pMethods = (sqlite3_io_methods *)0x0;
  pcVar21 = zPath;
  if (uVar23 == 0x100) {
    psVar11 = (sqlite3_io_methods *)findReusableFd(zPath,flags);
    if (psVar11 == (sqlite3_io_methods *)0x0) {
      iVar10 = sqlite3_initialize();
      iVar7 = 7;
      if ((iVar10 != 0) ||
         (psVar11 = (sqlite3_io_methods *)sqlite3Malloc(0x10), psVar11 == (sqlite3_io_methods *)0x0)
         ) goto LAB_00120c1d;
      iVar10 = -1;
    }
    else {
      iVar10 = psVar11->iVersion;
    }
    pFile[6].pMethods = psVar11;
  }
  else if (zPath == (char *)0x0) {
    pcVar21 = local_4e8;
    iVar7 = unixGetTempname(pVfs->mxPathname,pcVar21);
    iVar10 = -1;
    if (iVar7 != 0) goto LAB_00120c1d;
  }
  else {
    iVar10 = -1;
  }
  uVar18 = flags & 8;
  local_528 = flags & 1;
  if (iVar10 < 0) {
    uVar9 = flags & 0x80800;
    local_528 = flags & 1;
    if (uVar9 == 0) {
      if (uVar18 == 0) {
        uVar25 = 0;
        if ((flags & 0x40U) == 0) {
          uVar24 = 0;
          m = 0;
          uVar25 = 0;
        }
        else {
          pcVar14 = sqlite3_uri_parameter(pcVar21,"modeof");
          uVar24 = 0;
          m = 0;
          if (pcVar14 != (char *)0x0) {
            memset(&local_2d8,0xaa,0x90);
            iVar10 = (*aSyscall[4].pCurrent)(pcVar14,&local_2d8);
            uVar24 = local_2bc;
            goto joined_r0x0012093f;
          }
        }
      }
      else {
        m = 0x180;
        uVar25 = 0;
        uVar24 = 0;
      }
    }
    else {
      memset(&local_2d8,0xaa,0x201);
      if (pcVar21 == (char *)0x0) {
        uVar19 = 0;
      }
      else {
        sVar12 = strlen(pcVar21);
        uVar19 = (ulong)((uint)sVar12 & 0x3fffffff);
      }
      m = 0;
      uVar24 = 0;
      local_2b8 = 0;
      iVar7 = 0;
      do {
        uVar20 = uVar19;
        if ((long)uVar20 < 2) {
          iVar7 = 0;
          goto LAB_00120a5f;
        }
        if (pcVar21[uVar20 - 1] == '.') goto LAB_00120a5f;
        uVar19 = uVar20 - 1;
      } while (pcVar21[uVar20 - 1] != '-');
      __memcpy_chk(&local_2d8,pcVar21,uVar20 - 1,0x201);
      (&uStack_2d9)[uVar20] = 0;
      memset(&local_c8,0xaa,0x90);
      iVar10 = (*aSyscall[4].pCurrent)(&local_2d8,&local_c8);
      local_2c0 = local_b0;
      uVar24 = local_ac;
      local_2b8 = local_a8;
joined_r0x0012093f:
      if (iVar10 == 0) {
        m = local_2c0 & 0x1ff;
        iVar7 = 0;
      }
      else {
        uVar24 = 0;
        iVar7 = 0x70a;
        m = 0;
        local_2b8 = 0;
      }
LAB_00120a5f:
      uVar25 = local_2b8;
      if (iVar7 != 0) goto LAB_00120c1d;
    }
    f = (flags & 2U) + (flags & 4U) * 0x10 + (flags & 0x10U) * 8 + 0x20000;
    iVar10 = robust_open(pcVar21,f,m);
    if (-1 < iVar10) {
LAB_00120aa2:
      if ((uVar9 != 0 && m != 0) && (iVar7 = (*aSyscall[0x15].pCurrent)(), iVar7 == 0)) {
        (*aSyscall[0x14].pCurrent)(iVar10,(ulong)uVar24,(ulong)uVar25);
      }
      goto LAB_001204fe;
    }
    puVar16 = (uint *)__errno_location();
    if ((bVar2) && (*puVar16 == 0xd)) {
      iVar10 = (*aSyscall[2].pCurrent)(pcVar21,0);
      iVar7 = 0x608;
      if (iVar10 == 0) goto LAB_00120b0c;
    }
    else {
LAB_00120b0c:
      iVar7 = 0xe;
      if (((flags & 2U) != 0) && (*puVar16 != 0x15)) {
        flags = (flags & 0xfffffff8U) + 1;
        p = findReusableFd(pcVar21,flags);
        if (p == (UnixUnusedFd *)0x0) {
          iVar10 = robust_open(pcVar21,f & 0x20080,m);
        }
        else {
          iVar10 = p->fd;
          sqlite3_free(p);
        }
        if (-1 < iVar10) {
          local_528 = 1;
          goto LAB_00120aa2;
        }
      }
    }
    sqlite3_log(0xe,"%s at line %d of [%.10s]","cannot open file",0xafc2,
                "873d4e274b4988d260ba8354a9718324a1c26187a4ab4c1cc0227c03d0f10e70");
    if (pcVar21 == (char *)0x0) {
      pcVar21 = "";
    }
    sqlite3_log(0xe,"os_unix.c:%d: (%d) %s(%s) - %s",0xafc2,(ulong)*puVar16,"open",pcVar21,"");
LAB_00120c14:
    sqlite3_free(pFile[6].pMethods);
  }
  else {
LAB_001204fe:
    if (pOutFlags != (int *)0x0) {
      *pOutFlags = flags;
    }
    psVar11 = pFile[6].pMethods;
    if (psVar11 != (sqlite3_io_methods *)0x0) {
      psVar11->iVersion = iVar10;
      *(uint *)&psVar11->field_0x4 = flags & 3;
    }
    if (uVar18 != 0) {
      (*aSyscall[0x10].pCurrent)();
    }
    uVar9 = uVar18 * 4 + 2;
    if (local_528 == 0) {
      uVar9 = uVar18 * 4;
    }
    uVar18 = uVar9 + 0x80;
    if (uVar23 == 0x100) {
      uVar18 = uVar9;
    }
    uVar23 = uVar18 | 8;
    if (!bVar2) {
      uVar23 = uVar18;
    }
    *(int *)&pFile[3].pMethods = iVar10;
    pFile[1].pMethods = (sqlite3_io_methods *)pVfs;
    pFile[7].pMethods = (sqlite3_io_methods *)zPath;
    *(ushort *)((long)&pFile[3].pMethods + 6) = (ushort)(flags & 0x40U) | (ushort)uVar23;
    pFile[0xc].pMethods = (sqlite3_io_methods *)sqlite3Config.szMmap;
    pcVar21 = (char *)0x0;
    if ((flags & 0x40U) != 0 || (uVar23 & 0x40) != 0) {
      pcVar21 = zPath;
    }
    iVar7 = sqlite3_uri_boolean(pcVar21,"psow",1);
    if (iVar7 != 0) {
      pbVar1 = (byte *)((long)&pFile[3].pMethods + 6);
      *pbVar1 = *pbVar1 | 0x10;
    }
    iVar7 = strcmp(pVfs->zName,"unix-excl");
    if (iVar7 == 0) {
      pbVar1 = (byte *)((long)&pFile[3].pMethods + 6);
      *pbVar1 = *pbVar1 | 1;
    }
    if ((char)uVar23 < '\0') {
      psVar11 = &nolockIoMethods;
LAB_00120642:
      *(undefined4 *)&pFile[4].pMethods = 0;
    }
    else {
      psVar11 = (sqlite3_io_methods *)(**pVfs->pAppData)(zPath,pFile);
      psVar22 = &posixIoMethods;
      if (psVar11 == &posixIoMethods) {
        if (unixBigLock != (sqlite3_mutex *)0x0) {
          (*sqlite3Config.mutex.xMutexEnter)(unixBigLock);
        }
        memset(&local_2d8,0xaa,0x90);
        iVar7 = (*aSyscall[5].pCurrent)((ulong)*(uint *)&pFile[3].pMethods,&local_2d8);
        if (iVar7 == 0) {
          local_c8 = local_2d8;
          uVar4 = local_c8;
          uStack_c0 = p_Stack_2d0;
          p_Var5 = uStack_c0;
          for (psVar11 = (sqlite3_io_methods *)inodeList; local_c8 = uVar4, uStack_c0 = p_Var5,
              psVar11 != (sqlite3_io_methods *)0x0; psVar11 = (sqlite3_io_methods *)psVar11->xUnlock
              ) {
            local_c8._0_1_ = (char)local_2d8;
            local_c8._1_1_ = (char)((ulong)local_2d8 >> 8);
            local_c8._2_1_ = (char)((ulong)local_2d8 >> 0x10);
            local_c8._3_1_ = (char)((ulong)local_2d8 >> 0x18);
            local_c8._4_1_ = (char)((ulong)local_2d8 >> 0x20);
            local_c8._5_1_ = (char)((ulong)local_2d8 >> 0x28);
            local_c8._6_1_ = (char)((ulong)local_2d8 >> 0x30);
            local_c8._7_1_ = (char)((ulong)local_2d8 >> 0x38);
            uStack_c0._0_1_ = (char)p_Stack_2d0;
            uStack_c0._1_1_ = (char)((ulong)p_Stack_2d0 >> 8);
            uStack_c0._2_1_ = (char)((ulong)p_Stack_2d0 >> 0x10);
            uStack_c0._3_1_ = (char)((ulong)p_Stack_2d0 >> 0x18);
            uStack_c0._4_1_ = (char)((ulong)p_Stack_2d0 >> 0x20);
            uStack_c0._5_1_ = (char)((ulong)p_Stack_2d0 >> 0x28);
            uStack_c0._6_1_ = (char)((ulong)p_Stack_2d0 >> 0x30);
            uStack_c0._7_1_ = (char)((ulong)p_Stack_2d0 >> 0x38);
            auVar26[0] = -((char)((unixFileId *)&psVar11->iVersion)->dev == (char)local_c8);
            auVar26[1] = -(*(char *)((long)&((unixFileId *)&psVar11->iVersion)->dev + 1) ==
                          local_c8._1_1_);
            auVar26[2] = -(*(char *)((long)&((unixFileId *)&psVar11->iVersion)->dev + 2) ==
                          local_c8._2_1_);
            auVar26[3] = -(*(char *)((long)&((unixFileId *)&psVar11->iVersion)->dev + 3) ==
                          local_c8._3_1_);
            auVar26[4] = -(psVar11->field_0x4 == local_c8._4_1_);
            auVar26[5] = -(psVar11->field_0x5 == local_c8._5_1_);
            auVar26[6] = -(psVar11->field_0x6 == local_c8._6_1_);
            auVar26[7] = -(psVar11->field_0x7 == local_c8._7_1_);
            auVar26[8] = -(*(char *)&psVar11->xClose == (char)uStack_c0);
            auVar26[9] = -(*(char *)((long)&psVar11->xClose + 1) == uStack_c0._1_1_);
            auVar26[10] = -(*(char *)((long)&psVar11->xClose + 2) == uStack_c0._2_1_);
            auVar26[0xb] = -(*(char *)((long)&psVar11->xClose + 3) == uStack_c0._3_1_);
            auVar26[0xc] = -(*(char *)((long)&psVar11->xClose + 4) == uStack_c0._4_1_);
            auVar26[0xd] = -(*(char *)((long)&psVar11->xClose + 5) == uStack_c0._5_1_);
            auVar26[0xe] = -(*(char *)((long)&psVar11->xClose + 6) == uStack_c0._6_1_);
            auVar26[0xf] = -(*(char *)((long)&psVar11->xClose + 7) == uStack_c0._7_1_);
            if ((ushort)((ushort)(SUB161(auVar26 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar26 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar26 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar26 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar26 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar26 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar26 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar26 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar26 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar26 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar26 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar26 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar26 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar26 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar26 >> 0x77,0) & 1) << 0xe |
                        (ushort)(auVar26[0xf] >> 7) << 0xf) == 0xffff) {
              *(int *)&psVar11->xFileSize = *(int *)&psVar11->xFileSize + 1;
              psVar15 = (sqlite3_io_methods *)inodeList;
              goto LAB_00120c85;
            }
          }
          iVar8 = sqlite3_initialize();
          iVar7 = 7;
          if ((iVar8 != 0) ||
             (psVar11 = (sqlite3_io_methods *)sqlite3Malloc(0x50),
             psVar11 == (sqlite3_io_methods *)0x0)) goto LAB_001208bc;
          *(undefined1 (*) [16])&psVar11->xUnlock = (undefined1  [16])0x0;
          psVar11->xFileSize = (_func_int_sqlite3_file_ptr_sqlite3_int64_ptr *)0x0;
          psVar11->xLock = (_func_int_sqlite3_file_ptr_int *)0x0;
          psVar11->xTruncate = (_func_int_sqlite3_file_ptr_sqlite3_int64 *)0x0;
          psVar11->xSync = (_func_int_sqlite3_file_ptr_int *)0x0;
          *(undefined1 (*) [16])&psVar11->xRead = (undefined1  [16])0x0;
          psVar11->iVersion = 0;
          *(undefined4 *)&psVar11->field_0x4 = 0;
          psVar11->xClose = (_func_int_sqlite3_file_ptr *)0x0;
          *(undefined8 *)psVar11 = local_c8;
          psVar11->xClose = uStack_c0;
          if (sqlite3Config.bCoreMutex != '\0') {
            iVar8 = sqlite3_initialize();
            if (iVar8 == 0) {
              psVar17 = (*sqlite3Config.mutex.xMutexAlloc)(0);
              psVar11->xRead = (_func_int_sqlite3_file_ptr_void_ptr_int_sqlite3_int64 *)psVar17;
              if (psVar17 != (sqlite3_mutex *)0x0) goto LAB_00120c5a;
            }
            else {
              psVar11->xRead = (_func_int_sqlite3_file_ptr_void_ptr_int_sqlite3_int64 *)0x0;
            }
            sqlite3_free(psVar11);
            goto LAB_001208bc;
          }
LAB_00120c5a:
          *(int *)&psVar11->xFileSize = 1;
          psVar11->xUnlock = (_func_int_sqlite3_file_ptr_int *)inodeList;
          psVar11->xCheckReservedLock = (_func_int_sqlite3_file_ptr_int_ptr *)0x0;
          psVar15 = psVar11;
          if (inodeList != (unixInodeInfo *)0x0) {
            inodeList->pPrev = (unixInodeInfo *)psVar11;
          }
LAB_00120c85:
          inodeList = (unixInodeInfo *)psVar15;
          pFile[2].pMethods = psVar11;
          iVar7 = 0;
        }
        else {
          piVar13 = __errno_location();
          *(int *)&pFile[4].pMethods = *piVar13;
          iVar7 = 10;
LAB_001208bc:
          robust_close((unixFile *)pFile,iVar10,0xadad);
          iVar10 = -1;
        }
        if (unixBigLock != (sqlite3_mutex *)0x0) {
          (*sqlite3Config.mutex.xMutexLeave)(unixBigLock);
        }
      }
      else {
        psVar22 = &dotlockIoMethods;
        if (psVar11 != &dotlockIoMethods) goto LAB_00120642;
        sVar12 = strlen(zPath);
        iVar8 = sqlite3_initialize();
        iVar7 = 7;
        if (iVar8 == 0) {
          iVar8 = (int)sVar12 + 6;
          psVar15 = (sqlite3_io_methods *)sqlite3Malloc((long)iVar8);
          psVar11 = (sqlite3_io_methods *)0x0;
          if (psVar15 != (sqlite3_io_methods *)0x0) {
            sqlite3_snprintf(iVar8,(char *)psVar15,"%s.lock",zPath);
            iVar7 = 0;
            psVar11 = psVar15;
          }
        }
        else {
          psVar11 = (sqlite3_io_methods *)0x0;
        }
        pFile[5].pMethods = psVar11;
      }
      *(undefined4 *)&pFile[4].pMethods = 0;
      psVar11 = psVar22;
      if (iVar7 != 0) {
        if (-1 < iVar10) {
          robust_close((unixFile *)pFile,iVar10,0xae02);
        }
        goto LAB_00120c14;
      }
    }
    pFile->pMethods = psVar11;
    verifyDbFile((unixFile *)pFile);
    iVar7 = 0;
  }
LAB_00120c1d:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar7;
  }
  __stack_chk_fail();
}

Assistant:

static int unixOpen(
  sqlite3_vfs *pVfs,           /* The VFS for which this is the xOpen method */
  const char *zPath,           /* Pathname of file to be opened */
  sqlite3_file *pFile,         /* The file descriptor to be filled in */
  int flags,                   /* Input flags to control the opening */
  int *pOutFlags               /* Output flags returned to SQLite core */
){
  unixFile *p = (unixFile *)pFile;
  int fd = -1;                   /* File descriptor returned by open() */
  int openFlags = 0;             /* Flags to pass to open() */
  int eType = flags&0x0FFF00;  /* Type of file to open */
  int noLock;                    /* True to omit locking primitives */
  int rc = SQLITE_OK;            /* Function Return Code */
  int ctrlFlags = 0;             /* UNIXFILE_* flags */

  int isExclusive  = (flags & SQLITE_OPEN_EXCLUSIVE);
  int isDelete     = (flags & SQLITE_OPEN_DELETEONCLOSE);
  int isCreate     = (flags & SQLITE_OPEN_CREATE);
  int isReadonly   = (flags & SQLITE_OPEN_READONLY);
  int isReadWrite  = (flags & SQLITE_OPEN_READWRITE);
#if SQLITE_ENABLE_LOCKING_STYLE
  int isAutoProxy  = (flags & SQLITE_OPEN_AUTOPROXY);
#endif
#if defined(__APPLE__) || SQLITE_ENABLE_LOCKING_STYLE
  struct statfs fsInfo;
#endif

  /* If creating a super- or main-file journal, this function will open
  ** a file-descriptor on the directory too. The first time unixSync()
  ** is called the directory file descriptor will be fsync()ed and close()d.
  */
  int isNewJrnl = (isCreate && (
        eType==SQLITE_OPEN_SUPER_JOURNAL
     || eType==SQLITE_OPEN_MAIN_JOURNAL
     || eType==SQLITE_OPEN_WAL
  ));

  /* If argument zPath is a NULL pointer, this function is required to open
  ** a temporary file. Use this buffer to store the file name in.
  */
  char zTmpname[MAX_PATHNAME+2];
  const char *zName = zPath;

  /* Check the following statements are true:
  **
  **   (a) Exactly one of the READWRITE and READONLY flags must be set, and
  **   (b) if CREATE is set, then READWRITE must also be set, and
  **   (c) if EXCLUSIVE is set, then CREATE must also be set.
  **   (d) if DELETEONCLOSE is set, then CREATE must also be set.
  */
  assert((isReadonly==0 || isReadWrite==0) && (isReadWrite || isReadonly));
  assert(isCreate==0 || isReadWrite);
  assert(isExclusive==0 || isCreate);
  assert(isDelete==0 || isCreate);

  /* The main DB, main journal, WAL file and super-journal are never
  ** automatically deleted. Nor are they ever temporary files.  */
  assert( (!isDelete && zName) || eType!=SQLITE_OPEN_MAIN_DB );
  assert( (!isDelete && zName) || eType!=SQLITE_OPEN_MAIN_JOURNAL );
  assert( (!isDelete && zName) || eType!=SQLITE_OPEN_SUPER_JOURNAL );
  assert( (!isDelete && zName) || eType!=SQLITE_OPEN_WAL );

  /* Assert that the upper layer has set one of the "file-type" flags. */
  assert( eType==SQLITE_OPEN_MAIN_DB      || eType==SQLITE_OPEN_TEMP_DB
       || eType==SQLITE_OPEN_MAIN_JOURNAL || eType==SQLITE_OPEN_TEMP_JOURNAL
       || eType==SQLITE_OPEN_SUBJOURNAL   || eType==SQLITE_OPEN_SUPER_JOURNAL
       || eType==SQLITE_OPEN_TRANSIENT_DB || eType==SQLITE_OPEN_WAL
  );

  /* Detect a pid change and reset the PRNG.  There is a race condition
  ** here such that two or more threads all trying to open databases at
  ** the same instant might all reset the PRNG.  But multiple resets
  ** are harmless.
  */
  if( randomnessPid!=osGetpid(0) ){
    randomnessPid = osGetpid(0);
    sqlite3_randomness(0,0);
  }
  memset(p, 0, sizeof(unixFile));

#ifdef SQLITE_ASSERT_NO_FILES
  /* Applications that never read or write a persistent disk files */
  assert( zName==0 );
#endif

  if( eType==SQLITE_OPEN_MAIN_DB ){
    UnixUnusedFd *pUnused;
    pUnused = findReusableFd(zName, flags);
    if( pUnused ){
      fd = pUnused->fd;
    }else{
      pUnused = sqlite3_malloc64(sizeof(*pUnused));
      if( !pUnused ){
        return SQLITE_NOMEM_BKPT;
      }
    }
    p->pPreallocatedUnused = pUnused;

    /* Database filenames are double-zero terminated if they are not
    ** URIs with parameters.  Hence, they can always be passed into
    ** sqlite3_uri_parameter(). */
    assert( (flags & SQLITE_OPEN_URI) || zName[strlen(zName)+1]==0 );

  }else if( !zName ){
    /* If zName is NULL, the upper layer is requesting a temp file. */
    assert(isDelete && !isNewJrnl);
    rc = unixGetTempname(pVfs->mxPathname, zTmpname);
    if( rc!=SQLITE_OK ){
      return rc;
    }
    zName = zTmpname;

    /* Generated temporary filenames are always double-zero terminated
    ** for use by sqlite3_uri_parameter(). */
    assert( zName[strlen(zName)+1]==0 );
  }

  /* Determine the value of the flags parameter passed to POSIX function
  ** open(). These must be calculated even if open() is not called, as
  ** they may be stored as part of the file handle and used by the
  ** 'conch file' locking functions later on.  */
  if( isReadonly )  openFlags |= O_RDONLY;
  if( isReadWrite ) openFlags |= O_RDWR;
  if( isCreate )    openFlags |= O_CREAT;
  if( isExclusive ) openFlags |= (O_EXCL|O_NOFOLLOW);
  openFlags |= (O_LARGEFILE|O_BINARY|O_NOFOLLOW);

  if( fd<0 ){
    mode_t openMode;              /* Permissions to create file with */
    uid_t uid;                    /* Userid for the file */
    gid_t gid;                    /* Groupid for the file */
    rc = findCreateFileMode(zName, flags, &openMode, &uid, &gid);
    if( rc!=SQLITE_OK ){
      assert( !p->pPreallocatedUnused );
      assert( eType==SQLITE_OPEN_WAL || eType==SQLITE_OPEN_MAIN_JOURNAL );
      return rc;
    }
    fd = robust_open(zName, openFlags, openMode);
    OSTRACE(("OPENX   %-3d %s 0%o\n", fd, zName, openFlags));
    assert( !isExclusive || (openFlags & O_CREAT)!=0 );
    if( fd<0 ){
      if( isNewJrnl && errno==EACCES && osAccess(zName, F_OK) ){
        /* If unable to create a journal because the directory is not
        ** writable, change the error code to indicate that. */
        rc = SQLITE_READONLY_DIRECTORY;
      }else if( errno!=EISDIR && isReadWrite ){
        /* Failed to open the file for read/write access. Try read-only. */
        UnixUnusedFd *pReadonly = 0;
        flags &= ~(SQLITE_OPEN_READWRITE|SQLITE_OPEN_CREATE);
        openFlags &= ~(O_RDWR|O_CREAT);
        flags |= SQLITE_OPEN_READONLY;
        openFlags |= O_RDONLY;
        isReadonly = 1;
        pReadonly = findReusableFd(zName, flags);
        if( pReadonly ){
          fd = pReadonly->fd;
          sqlite3_free(pReadonly);
        }else{
          fd = robust_open(zName, openFlags, openMode);
        }
      }
    }
    if( fd<0 ){
      int rc2 = unixLogError(SQLITE_CANTOPEN_BKPT, "open", zName);
      if( rc==SQLITE_OK ) rc = rc2;
      goto open_finished;
    }

    /* The owner of the rollback journal or WAL file should always be the
    ** same as the owner of the database file.  Try to ensure that this is
    ** the case.  The chown() system call will be a no-op if the current
    ** process lacks root privileges, be we should at least try.  Without
    ** this step, if a root process opens a database file, it can leave
    ** behinds a journal/WAL that is owned by root and hence make the
    ** database inaccessible to unprivileged processes.
    **
    ** If openMode==0, then that means uid and gid are not set correctly
    ** (probably because SQLite is configured to use 8+3 filename mode) and
    ** in that case we do not want to attempt the chown().
    */
    if( openMode && (flags & (SQLITE_OPEN_WAL|SQLITE_OPEN_MAIN_JOURNAL))!=0 ){
      robustFchown(fd, uid, gid);
    }
  }
  assert( fd>=0 );
  if( pOutFlags ){
    *pOutFlags = flags;
  }

  if( p->pPreallocatedUnused ){
    p->pPreallocatedUnused->fd = fd;
    p->pPreallocatedUnused->flags =
                          flags & (SQLITE_OPEN_READONLY|SQLITE_OPEN_READWRITE);
  }

  if( isDelete ){
#if OS_VXWORKS
    zPath = zName;
#elif defined(SQLITE_UNLINK_AFTER_CLOSE)
    zPath = sqlite3_mprintf("%s", zName);
    if( zPath==0 ){
      robust_close(p, fd, __LINE__);
      return SQLITE_NOMEM_BKPT;
    }
#else
    osUnlink(zName);
#endif
  }
#if SQLITE_ENABLE_LOCKING_STYLE
  else{
    p->openFlags = openFlags;
  }
#endif

#if defined(__APPLE__) || SQLITE_ENABLE_LOCKING_STYLE
  if( fstatfs(fd, &fsInfo) == -1 ){
    storeLastErrno(p, errno);
    robust_close(p, fd, __LINE__);
    return SQLITE_IOERR_ACCESS;
  }
  if (0 == strncmp("msdos", fsInfo.f_fstypename, 5)) {
    ((unixFile*)pFile)->fsFlags |= SQLITE_FSFLAGS_IS_MSDOS;
  }
  if (0 == strncmp("exfat", fsInfo.f_fstypename, 5)) {
    ((unixFile*)pFile)->fsFlags |= SQLITE_FSFLAGS_IS_MSDOS;
  }
#endif

  /* Set up appropriate ctrlFlags */
  if( isDelete )                ctrlFlags |= UNIXFILE_DELETE;
  if( isReadonly )              ctrlFlags |= UNIXFILE_RDONLY;
  noLock = eType!=SQLITE_OPEN_MAIN_DB;
  if( noLock )                  ctrlFlags |= UNIXFILE_NOLOCK;
  if( isNewJrnl )               ctrlFlags |= UNIXFILE_DIRSYNC;
  if( flags & SQLITE_OPEN_URI ) ctrlFlags |= UNIXFILE_URI;

#if SQLITE_ENABLE_LOCKING_STYLE
#if SQLITE_PREFER_PROXY_LOCKING
  isAutoProxy = 1;
#endif
  if( isAutoProxy && (zPath!=NULL) && (!noLock) && pVfs->xOpen ){
    char *envforce = getenv("SQLITE_FORCE_PROXY_LOCKING");
    int useProxy = 0;

    /* SQLITE_FORCE_PROXY_LOCKING==1 means force always use proxy, 0 means
    ** never use proxy, NULL means use proxy for non-local files only.  */
    if( envforce!=NULL ){
      useProxy = atoi(envforce)>0;
    }else{
      useProxy = !(fsInfo.f_flags&MNT_LOCAL);
    }
    if( useProxy ){
      rc = fillInUnixFile(pVfs, fd, pFile, zPath, ctrlFlags);
      if( rc==SQLITE_OK ){
        rc = proxyTransformUnixFile((unixFile*)pFile, ":auto:");
        if( rc!=SQLITE_OK ){
          /* Use unixClose to clean up the resources added in fillInUnixFile
          ** and clear all the structure's references.  Specifically,
          ** pFile->pMethods will be NULL so sqlite3OsClose will be a no-op
          */
          unixClose(pFile);
          return rc;
        }
      }
      goto open_finished;
    }
  }
#endif

  assert( zPath==0 || zPath[0]=='/'
      || eType==SQLITE_OPEN_SUPER_JOURNAL || eType==SQLITE_OPEN_MAIN_JOURNAL
  );
  rc = fillInUnixFile(pVfs, fd, pFile, zPath, ctrlFlags);

open_finished:
  if( rc!=SQLITE_OK ){
    sqlite3_free(p->pPreallocatedUnused);
  }
  return rc;
}